

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTargetInternals::cmTargetInternals(cmTargetInternals *this)

{
  _Rb_tree_header *p_Var1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  undefined8 local_f8;
  char *pcStack_f0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  undefined8 local_d0;
  char *pcStack_c8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  undefined8 local_a8;
  char *pcStack_a0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  undefined8 local_80;
  char *pcStack_78;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  undefined8 local_58;
  char *pcStack_50;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[4] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[5] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[2] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[0] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->InstallPath)._M_dataplus._M_p = (pointer)&(this->InstallPath).field_2;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)&(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  (this->Properties).Map_._M_h._M_buckets = &(this->Properties).Map_._M_h._M_single_bucket;
  (this->Properties).Map_._M_h._M_bucket_count = 1;
  (this->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Properties).Map_._M_h._M_element_count = 0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InstallGenerators).
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageStandardProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludeDirectoriesEntries).
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->FileSets)._M_t._M_impl.super__Rb_tree_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&(this->InstallIncludeDirectoriesEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count,
         0,0x128);
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  local_58 = 0xb;
  pcStack_50 = "HEADER_SETS";
  local_80 = 0x15;
  pcStack_78 = "INTERFACE_HEADER_SETS";
  (this->HeadersFileSets).TypeName.super_string_view._M_len = 7;
  (this->HeadersFileSets).TypeName.super_string_view._M_str = "HEADERS";
  (this->HeadersFileSets).DefaultDirectoryProperty.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).DefaultDirectoryProperty.super_string_view._M_str = "HEADER_DIRS";
  (this->HeadersFileSets).DefaultPathProperty.super_string_view._M_len = 10;
  (this->HeadersFileSets).DefaultPathProperty.super_string_view._M_str = "HEADER_SET";
  (this->HeadersFileSets).DirectoryPrefix.super_string_view._M_len = 0xc;
  (this->HeadersFileSets).DirectoryPrefix.super_string_view._M_str = "HEADER_DIRS_";
  (this->HeadersFileSets).PathPrefix.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).PathPrefix.super_string_view._M_str = "HEADER_SET_";
  (this->HeadersFileSets).TypeDescription.super_string_view._M_len = 6;
  (this->HeadersFileSets).TypeDescription.super_string_view._M_str = "Header";
  (this->HeadersFileSets).DefaultDescription.super_string_view._M_len = 0x16;
  (this->HeadersFileSets).DefaultDescription.super_string_view._M_str = "The default header set";
  (this->HeadersFileSets).ArbitraryDescription.super_string_view._M_len = 10;
  (this->HeadersFileSets).ArbitraryDescription.super_string_view._M_str = "Header set";
  (this->HeadersFileSets).SelfEntries.PropertyName.super_string_view._M_len = 0xb;
  (this->HeadersFileSets).SelfEntries.PropertyName.super_string_view._M_str = "HEADER_SETS";
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_len = 0x15;
  (this->HeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_str =
       "INTERFACE_HEADER_SETS";
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_70);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  local_a8 = 0xf;
  pcStack_a0 = "CXX_MODULE_SETS";
  local_d0 = 0x19;
  pcStack_c8 = "INTERFACE_CXX_MODULE_SETS";
  (this->CxxModulesFileSets).TypeName.super_string_view._M_len = 0xb;
  (this->CxxModulesFileSets).TypeName.super_string_view._M_str = "CXX_MODULES";
  (this->CxxModulesFileSets).DefaultDirectoryProperty.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).DefaultDirectoryProperty.super_string_view._M_str = "CXX_MODULE_DIRS";
  (this->CxxModulesFileSets).DefaultPathProperty.super_string_view._M_len = 0xe;
  (this->CxxModulesFileSets).DefaultPathProperty.super_string_view._M_str = "CXX_MODULE_SET";
  (this->CxxModulesFileSets).DirectoryPrefix.super_string_view._M_len = 0x10;
  (this->CxxModulesFileSets).DirectoryPrefix.super_string_view._M_str = "CXX_MODULE_DIRS_";
  (this->CxxModulesFileSets).PathPrefix.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).PathPrefix.super_string_view._M_str = "CXX_MODULE_SET_";
  (this->CxxModulesFileSets).TypeDescription.super_string_view._M_len = 10;
  (this->CxxModulesFileSets).TypeDescription.super_string_view._M_str = "C++ module";
  (this->CxxModulesFileSets).DefaultDescription.super_string_view._M_len = 0x1a;
  (this->CxxModulesFileSets).DefaultDescription.super_string_view._M_str =
       "The default C++ module set";
  (this->CxxModulesFileSets).ArbitraryDescription.super_string_view._M_len = 0xe;
  (this->CxxModulesFileSets).ArbitraryDescription.super_string_view._M_str = "C++ module set";
  (this->CxxModulesFileSets).SelfEntries.PropertyName.super_string_view._M_len = 0xf;
  (this->CxxModulesFileSets).SelfEntries.PropertyName.super_string_view._M_str = "CXX_MODULE_SETS";
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModulesFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.PropertyName.super_string_view._M_len = 0x19;
  (this->CxxModulesFileSets).InterfaceEntries.PropertyName.super_string_view._M_str =
       "INTERFACE_CXX_MODULE_SETS";
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModulesFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_98);
  local_f8 = 0x1b;
  pcStack_f0 = "CXX_MODULE_HEADER_UNIT_SETS";
  (this->CxxModuleHeadersFileSets).TypeName.super_string_view._M_len = 0x17;
  (this->CxxModuleHeadersFileSets).TypeName.super_string_view._M_str = "CXX_MODULE_HEADER_UNITS";
  (this->CxxModuleHeadersFileSets).DefaultDirectoryProperty.super_string_view._M_len = 0x1b;
  (this->CxxModuleHeadersFileSets).DefaultDirectoryProperty.super_string_view._M_str =
       "CXX_MODULE_HEADER_UNIT_DIRS";
  (this->CxxModuleHeadersFileSets).DefaultPathProperty.super_string_view._M_len = 0x1a;
  (this->CxxModuleHeadersFileSets).DefaultPathProperty.super_string_view._M_str =
       "CXX_MODULE_HEADER_UNIT_SET";
  (this->CxxModuleHeadersFileSets).DirectoryPrefix.super_string_view._M_len = 0x1c;
  (this->CxxModuleHeadersFileSets).DirectoryPrefix.super_string_view._M_str =
       "CXX_MODULE_HEADER_UNIT_DIRS_";
  (this->CxxModuleHeadersFileSets).PathPrefix.super_string_view._M_len = 0x1b;
  (this->CxxModuleHeadersFileSets).PathPrefix.super_string_view._M_str =
       "CXX_MODULE_HEADER_UNIT_SET_";
  (this->CxxModuleHeadersFileSets).TypeDescription.super_string_view._M_len = 0x11;
  (this->CxxModuleHeadersFileSets).TypeDescription.super_string_view._M_str = "C++ module header";
  (this->CxxModuleHeadersFileSets).DefaultDescription.super_string_view._M_len = 0x21;
  (this->CxxModuleHeadersFileSets).DefaultDescription.super_string_view._M_str =
       "The default C++ module header set";
  (this->CxxModuleHeadersFileSets).ArbitraryDescription.super_string_view._M_len = 0x15;
  (this->CxxModuleHeadersFileSets).ArbitraryDescription.super_string_view._M_str =
       "C++ module header set";
  (this->CxxModuleHeadersFileSets).SelfEntries.PropertyName.super_string_view._M_len = 0x1b;
  (this->CxxModuleHeadersFileSets).SelfEntries.PropertyName.super_string_view._M_str =
       "CXX_MODULE_HEADER_UNIT_SETS";
  (this->CxxModuleHeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModuleHeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModuleHeadersFileSets).SelfEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModuleHeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_len = 0x25;
  (this->CxxModuleHeadersFileSets).InterfaceEntries.PropertyName.super_string_view._M_str =
       "INTERFACE_CXX_MODULE_HEADER_UNIT_SETS";
  (this->CxxModuleHeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CxxModuleHeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CxxModuleHeadersFileSets).InterfaceEntries.Entries.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_110);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

cmTargetInternals::cmTargetInternals()
  : HeadersFileSets("HEADERS"_s, "HEADER_DIRS"_s, "HEADER_SET"_s,
                    "HEADER_DIRS_"_s, "HEADER_SET_"_s, "Header"_s,
                    "The default header set"_s, "Header set"_s,
                    FileSetEntries("HEADER_SETS"_s),
                    FileSetEntries("INTERFACE_HEADER_SETS"_s))
  , CxxModulesFileSets("CXX_MODULES"_s, "CXX_MODULE_DIRS"_s,
                       "CXX_MODULE_SET"_s, "CXX_MODULE_DIRS_"_s,
                       "CXX_MODULE_SET_"_s, "C++ module"_s,
                       "The default C++ module set"_s, "C++ module set"_s,
                       FileSetEntries("CXX_MODULE_SETS"_s),
                       FileSetEntries("INTERFACE_CXX_MODULE_SETS"_s))
  , CxxModuleHeadersFileSets(
      "CXX_MODULE_HEADER_UNITS"_s, "CXX_MODULE_HEADER_UNIT_DIRS"_s,
      "CXX_MODULE_HEADER_UNIT_SET"_s, "CXX_MODULE_HEADER_UNIT_DIRS_"_s,
      "CXX_MODULE_HEADER_UNIT_SET_"_s, "C++ module header"_s,
      "The default C++ module header set"_s, "C++ module header set"_s,
      FileSetEntries("CXX_MODULE_HEADER_UNIT_SETS"_s),
      FileSetEntries("INTERFACE_CXX_MODULE_HEADER_UNIT_SETS"_s))
{
}